

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

int vt_fix_cb(void *sysdata,void *userdata)

{
  short *psVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  prf_state_t *state;
  
  psVar1 = *(short **)((long)sysdata + 8);
  if ((*(byte *)(psVar1 + 2) & 1) == 0) {
    iVar5 = 1;
    if ((*psVar1 == 0x59) || (*psVar1 == 0x48)) {
      lVar2 = *(long *)(psVar1 + 4);
      uVar3 = (long)(int)((ushort)psVar1[1] - 4) / 4;
      uVar6 = 0;
      uVar4 = uVar3 & 0xffffffff;
      if ((int)uVar3 < 1) {
        uVar4 = uVar6;
      }
      for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        *(undefined4 *)(lVar2 + uVar6 * 4) =
             *(undefined4 *)((long)userdata + (ulong)*(uint *)(lVar2 + uVar6 * 4));
      }
    }
  }
  else {
    iVar5 = 2;
  }
  return iVar5;
}

Assistant:

static
int
vt_fix_cb(
    void * sysdata,
    void * userdata )
{
    prf_state_t * state = (prf_state_t *) sysdata;
    uint8_t * rlt = (uint8_t *) userdata;
    prf_node_t * node = state->node;

    if ( node->flags & PRF_NODE_DELETED )
        return PRF_TRAV_SIBLING;

    switch ( node->opcode ) {
    case 72: /* vertex list */
    case 89: /* morph vertex list */
        do {
            int i, num;
            uint32_t * data;
            data = (uint32_t *) node->data;
            num = (node->length - 4) / 4;
            for ( i = 0; i < num; i++ )
                data[i] = ((uint32_t *)(rlt + data[i]))[0];
        } while ( FALSE );
        break;
    default:
        break;
    }
    return PRF_TRAV_CONTINUE;
}